

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,string *address,uint16_t portNum
          ,bool port_reuse,int nominalBufferSize)

{
  pointer *ppbVar1;
  long lVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  uint __val;
  long lVar10;
  uint __len;
  long lVar11;
  string __str;
  query query;
  resolver resolver;
  uint16_t local_132;
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
  *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  protocol_type local_11c;
  undefined1 local_118 [40];
  basic_resolver_query<asio::ip::tcp> local_f0;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
  super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioctx = io_context;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket_factory).super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this
  .super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar6 = sf->handshake_server;
  (this->socket_factory).encrypted = sf->encrypted;
  (this->socket_factory).handshake_server = bVar6;
  local_130 = (vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
               *)&this->endpoints;
  (this->accepting).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->accepting).super___mutex_base._M_mutex + 0x10) = 0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->accepting).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->acceptors).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bufferSize = (long)nominalBufferSize;
  *(undefined8 *)&(this->dataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->dataCall).super__Function_base._M_functor + 8) = 0;
  (this->dataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->dataCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->errorCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCall).super__Function_base._M_functor + 8) = 0;
  (this->errorCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCall)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logFunction).super__Function_base._M_functor + 8) = 0;
  (this->logFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logFunction)._M_invoker = (_Invoker_type)0x0;
  (this->halted)._M_base._M_i = false;
  this->reuse_address = port_reuse;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_132 = portNum;
  iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,"*");
  if ((iVar8 == 0) ||
     (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,
                      "tcp://*"), iVar8 == 0)) {
    local_f0.hints_.ai_flags = 0;
    std::
    vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
    ::emplace_back<asio::ip::address_v4,unsigned_short&>
              (local_130,(address_v4 *)&local_f0,&local_132);
  }
  else {
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,
                    "localhost");
    if (iVar8 == 0) {
      local_f0.hints_.ai_flags = 2;
      std::
      vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
      ::emplace_back<asio::ip::tcp,unsigned_short&>(local_130,(tcp *)&local_f0,&local_132);
    }
    else {
      asio::detail::
      io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
      io_object_impl<asio::io_context>(&local_80,0,0,io_context);
      local_11c.family_ = 2;
      __len = 1;
      __val = (uint)local_132;
      if (((9 < local_132) && (__len = 2, 99 < local_132)) && (__len = 3, 999 < local_132)) {
        __len = 5 - (__val < 10000);
      }
      local_118._0_8_ = local_118 + 0x10;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (ulong)__len,'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_118._0_8_,__len,__val);
      asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                (&local_f0,&local_11c,address,(string *)local_118,canonical_name);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,CONCAT44(local_118._20_4_,local_118._16_4_) + 1);
      }
      asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
                ((results_type *)local_118,
                 (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,&local_f0);
      uVar7 = local_118._0_8_;
      local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_118._12_4_,local_118._8_4_);
      if ((long *)local_118._0_8_ == (long *)0x0) {
        LOCK();
        (this->halted)._M_base._M_i = true;
        UNLOCK();
      }
      else {
        lVar10 = CONCAT44(local_118._20_4_,local_118._16_4_);
        lVar11 = lVar10 * 0x60;
        do {
          lVar2 = *(long *)uVar7;
          local_118._0_8_ = *(undefined8 *)(lVar2 + lVar11);
          uVar3 = ((undefined8 *)(lVar2 + lVar11))[1];
          puVar9 = (undefined8 *)(lVar2 + 0xc + lVar11);
          uVar4 = puVar9[1];
          local_118._16_4_ = (undefined4)((ulong)*puVar9 >> 0x20);
          local_118._20_4_ = (undefined4)uVar4;
          local_118._24_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          local_118._8_4_ = (undefined4)uVar3;
          local_118._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
          __position._M_current =
               (this->endpoints).
               super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->endpoints).
              super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
            ::_M_realloc_insert<asio::ip::basic_endpoint<asio::ip::tcp>>
                      (local_130,__position,(basic_endpoint<asio::ip::tcp> *)local_118);
          }
          else {
            puVar9 = (undefined8 *)(lVar2 + lVar11);
            uVar4 = *puVar9;
            uVar5 = puVar9[1];
            uVar3 = puVar9[2];
            ((__position._M_current)->impl_).data_.v6.sin6_scope_id = *(uint32_t *)(puVar9 + 3);
            *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 0x10) = uVar3;
            *(undefined8 *)&((__position._M_current)->impl_).data_ = uVar4;
            *(undefined8 *)((long)&((__position._M_current)->impl_).data_ + 8) = uVar5;
            ppbVar1 = &(this->endpoints).
                       super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x60;
        } while (lVar10 != (*(long *)(uVar7 + 8) - *(long *)uVar7 >> 5) * -0x5555555555555555);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.service_name_._M_dataplus._M_p != &local_f0.service_name_.field_2) {
        operator_delete(local_f0.service_name_._M_dataplus._M_p,
                        local_f0.service_name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.host_name_._M_dataplus._M_p != &local_f0.host_name_.field_2) {
        operator_delete(local_f0.host_name_._M_dataplus._M_p,
                        local_f0.host_name_.field_2._M_allocated_capacity + 1);
      }
      asio::detail::
      io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
      ~io_object_impl(&local_80);
      if ((long *)uVar7 == (long *)0x0) {
        return;
      }
    }
  }
  initialConnect(this);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    uint16_t portNum,
    bool port_reuse,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize),
    reuse_address(port_reuse)
{
    if ((address == "*") || (address == "tcp://*")) {
        endpoints.emplace_back(asio::ip::address_v4::any(), portNum);
        //      endpoints.emplace_back (asio::ip::address_v6::any (), portNum);
    } else if (address == "localhost") {
        endpoints.emplace_back(asio::ip::tcp::v4(), portNum);
    } else {
        tcp::resolver resolver(io_context);
        tcp::resolver::query query(
            tcp::v4(),
            address,
            std::to_string(portNum),
            tcp::resolver::query::canonical_name);
        tcp::resolver::iterator endpoint_iterator = resolver.resolve(query);
        tcp::resolver::iterator end;
        if (endpoint_iterator != end) {
            while (endpoint_iterator != end) {
                endpoints.push_back(*endpoint_iterator);
                ++endpoint_iterator;
            }
        } else {
            halted = true;
            return;
        }
    }
    initialConnect();
}